

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

macro_call_t try_param_macro_call(c2m_ctx_t c2m_ctx,macro_t m,token_t macro_id)

{
  ushort uVar1;
  pre_ctx *ppVar2;
  macro_t pmVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  macro_call_t pmVar6;
  int iVar7;
  token_t ptVar8;
  token_t ptVar9;
  VARR_token_arr_t *varr;
  token_arr_t *ppVVar10;
  size_t ix;
  token_arr_t pVVar11;
  size_t sVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  token_t t;
  int iVar17;
  bool bVar18;
  bool bVar19;
  VARR_token_t *local_60;
  macro_t local_58;
  token_arr_t local_50;
  size_t local_48;
  pre_ctx *local_40;
  macro_call_t local_38;
  
  ppVar2 = c2m_ctx->pre_ctx;
  while( true ) {
    ptVar8 = get_next_pptoken(c2m_ctx);
    if ((short)*(uint *)ptVar8 != 0x145) break;
    pop_macro_call(c2m_ctx);
  }
  uVar14 = *(uint *)ptVar8 & 0xffff;
  if ((uVar14 == 10) || (uVar14 == 0x20)) {
    ptVar9 = get_next_pptoken(c2m_ctx);
    uVar14 = (uint)*(ushort *)ptVar9;
    t = ptVar8;
  }
  else {
    t = (token_t)0x0;
    ptVar9 = ptVar8;
  }
  if (uVar14 != 0x28) {
    unget_next_pptoken(c2m_ctx,ptVar9);
    if (t != (token_t)0x0) {
      unget_next_pptoken(c2m_ctx,t);
    }
    out_token(c2m_ctx,macro_id);
    return (macro_call_t)0x0;
  }
  local_38 = new_macro_call(m,macro_id->pos);
  pmVar3 = local_38->macro;
  pcVar16 = &DAT_00000018;
  varr = (VARR_token_arr_t *)malloc(0x18);
  if (varr == (VARR_token_arr_t *)0x0) {
    mir_varr_error(pcVar16);
  }
  varr->els_num = 0;
  varr->size = 0x10;
  local_40 = ppVar2;
  ppVVar10 = (token_arr_t *)malloc(0x80);
  varr->varr = ppVVar10;
  VARR_token_tcreate(&local_60,0x10);
  local_58 = pmVar3;
  ix = VARR_token_tlength(pmVar3->params);
  iVar17 = 0;
  bVar18 = false;
  if (ix == 1) {
    ptVar8 = VARR_token_tget(local_58->params,0);
    bVar18 = *(short *)ptVar8 == 0x10f;
  }
  local_48 = ix - 1;
  bVar19 = false;
  while( true ) {
    ptVar8 = get_next_pptoken(c2m_ctx);
    uVar1 = *(ushort *)ptVar8;
    if (uVar1 == 0x145) {
      ptVar8 = get_next_pptoken(c2m_ctx);
      pop_macro_call(c2m_ctx);
      uVar1 = *(ushort *)ptVar8;
    }
    uVar14 = (uint)uVar1;
    uVar15 = uVar14 * 0x10000 + 0xfec30000 >> 0x10;
    if (((uVar15 < 0xb) && ((0x5c1U >> (uVar15 & 0x1f) & 1) != 0)) ||
       ((bool)(bVar19 & uVar14 == 0x23))) break;
    if (iVar17 == 0) {
      if (uVar14 == 0x29) break;
      if ((bVar18) || (uVar14 != 0x2c)) goto LAB_0016143f;
      VARR_token_arr_tpush(varr,local_60);
      VARR_token_tcreate(&local_60,0x10);
      iVar17 = 0;
      if (varr->els_num == local_48) {
        ptVar9 = VARR_token_tget(local_58->params,local_48);
        iVar7 = strcmp(ptVar9->repr,"...");
        bVar18 = iVar7 == 0;
      }
      else {
        bVar18 = false;
      }
    }
    else {
LAB_0016143f:
      VARR_token_tpush(local_60,ptVar8);
      if (*(short *)ptVar8 == 0x28) {
        iVar17 = iVar17 + 1;
      }
      else if (*(short *)ptVar8 == 0x29) {
        iVar17 = iVar17 + -1;
      }
    }
    bVar19 = *(short *)ptVar8 == 10;
  }
  if (uVar14 != 0x29) {
    uVar4._0_4_ = (ptVar8->pos).lno;
    uVar4._4_4_ = (ptVar8->pos).ln_pos;
    error(c2m_ctx,0x18e6ba,(ptVar8->pos).fname,uVar4,local_58->id->repr);
    unget_next_pptoken(c2m_ctx,ptVar8);
  }
  VARR_token_arr_tpush(varr,local_60);
  if ((ix == 0) && (varr->els_num == 1)) {
    pVVar11 = VARR_token_arr_tget(varr,0);
    sVar12 = VARR_token_tlength(pVVar11);
    if ((sVar12 == 0) ||
       ((sVar12 = VARR_token_tlength(pVVar11), sVar12 == 1 &&
        (ptVar9 = VARR_token_tget(pVVar11,0), *(short *)ptVar9 == 0x20)))) {
      local_50 = VARR_token_arr_tpop(varr);
      VARR_token_tdestroy(&local_50);
      goto LAB_00161659;
    }
  }
  uVar13 = varr->els_num;
  if (ix < uVar13) {
    pVVar11 = VARR_token_arr_tget(varr,ix);
    sVar12 = VARR_token_tlength(pVVar11);
    if (sVar12 != 0) {
      ptVar8 = VARR_token_tget(pVVar11,0);
    }
    pcVar16 = "too many args for call of macro %s";
    while (ix < varr->els_num) {
      local_50 = VARR_token_arr_tpop(varr);
      VARR_token_tdestroy(&local_50);
    }
  }
  else {
    if (ix <= uVar13) goto LAB_00161659;
    while (uVar13 < ix) {
      VARR_token_tcreate(&local_60,0x10);
      VARR_token_arr_tpush(varr,local_60);
      uVar13 = varr->els_num;
    }
    pcVar16 = "not enough args for call of macro %s";
  }
  uVar5._0_4_ = (ptVar8->pos).lno;
  uVar5._4_4_ = (ptVar8->pos).ln_pos;
  error(c2m_ctx,pcVar16,(ptVar8->pos).fname,uVar5,local_58->id->repr);
LAB_00161659:
  pmVar6 = local_38;
  local_38->args = varr;
  VARR_macro_call_tpush(local_40->macro_call_stack,local_38);
  return pmVar6;
}

Assistant:

static macro_call_t try_param_macro_call (c2m_ctx_t c2m_ctx, macro_t m, token_t macro_id) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  macro_call_t mc;
  token_t t1 = get_next_pptoken (c2m_ctx), t2 = NULL;

  while (t1->code == T_EOR) {
    pop_macro_call (c2m_ctx);
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code == ' ' || t1->code == '\n') {
    t2 = t1;
    t1 = get_next_pptoken (c2m_ctx);
  }
  if (t1->code != '(') { /* no args: it is not a macro call */
    unget_next_pptoken (c2m_ctx, t1);
    if (t2 != NULL) unget_next_pptoken (c2m_ctx, t2);
    out_token (c2m_ctx, macro_id);
    return NULL;
  }
  mc = new_macro_call (m, macro_id->pos);
  find_args (c2m_ctx, mc);
  VARR_PUSH (macro_call_t, macro_call_stack, mc);
  return mc;
}